

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Condition.h
# Opt level: O0

__pid_t __thiscall sznet::Condition::wait(Condition *this,void *__stat_loc)

{
  __pid_t extraout_EAX;
  sz_mutex_t *mutex;
  LogStream *this_00;
  SourceFile file;
  undefined1 local_1010 [12];
  Logger local_1000;
  int local_1c;
  int rst;
  UnassignGuard ug;
  Condition *this_local;
  
  ug.m_owner = (MutexLock *)this;
  MutexLock::UnassignGuard::UnassignGuard((UnassignGuard *)&stack0xffffffffffffffe8,this->m_mutex);
  mutex = MutexLock::getPthreadMutex(this->m_mutex);
  local_1c = sz_cond_wait(&this->m_cond,mutex);
  if (local_1c != 0) {
    Logger::SourceFile::SourceFile<108>
              ((SourceFile *)local_1010,
               (char (*) [108])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/../thread/Condition.h"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_1010._0_8_;
    file.m_size = local_1010._8_4_;
    Logger::Logger(&local_1000,file,0x22,true);
    this_00 = Logger::stream(&local_1000);
    LogStream::operator<<(this_00,"Failed in sz_cond_wait");
    Logger::~Logger(&local_1000);
  }
  MutexLock::UnassignGuard::~UnassignGuard((UnassignGuard *)&stack0xffffffffffffffe8);
  return extraout_EAX;
}

Assistant:

void wait()
	{
		MutexLock::UnassignGuard ug(m_mutex);
		auto rst = sz_cond_wait(&m_cond, m_mutex.getPthreadMutex());
		if (rst != 0)
		{
			LOG_SYSFATAL << "Failed in sz_cond_wait";
		}
	}